

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

int adj_lev(d_level *dlev,permonst *ptr)

{
  xchar xVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  short sVar5;
  int iVar6;
  
  if (ptr != mons + 0x128) {
    iVar6 = (int)ptr->mlevel;
    if (iVar6 < 0x32) {
      xVar1 = level_difficulty(dlev);
      iVar4 = (int)xVar1 - (int)ptr->mlevel;
      if (iVar4 < 0) {
        iVar6 = iVar6 + -1;
      }
      else {
        iVar6 = iVar6 + (uint)(byte)(((ushort)iVar4 & 0xff) / 5);
      }
      sVar2 = (short)(ptr->mlevel * 3) / 2;
      sVar5 = 0x31;
      if (sVar2 < 0x31) {
        sVar5 = sVar2;
      }
      iVar4 = 0;
      if (0 < iVar6) {
        iVar4 = iVar6;
      }
      if (sVar5 < iVar6) {
        iVar4 = (int)sVar5;
      }
    }
    else {
      iVar4 = 0x32;
    }
    return iVar4;
  }
  uVar3 = 0x31;
  if (mvitals[0x128].died + 0x1e < 0x31) {
    uVar3 = mvitals[0x128].died + 0x1e;
  }
  return uVar3;
}

Assistant:

int adj_lev(const d_level *dlev, const struct permonst *ptr)
{
	int	tmp, tmp2;

	if (ptr == &mons[PM_WIZARD_OF_YENDOR]) {
		/* does not depend on other strengths, but does get stronger
		 * every time he is killed
		 */
		tmp = ptr->mlevel + mvitals[PM_WIZARD_OF_YENDOR].died;
		if (tmp > 49) tmp = 49;
		return tmp;
	}

	if (ptr->mlevel > 49) return 50; /* "special" demons/devils */
	tmp = ptr->mlevel;
	tmp2 = level_difficulty(dlev) - ptr->mlevel;
	if (tmp2 < 0) tmp--;		/* if mlevel > u.uz decrement tmp */
	else tmp += (tmp2 / 5);		/* else increment 1 per five diff */

	tmp2 = (3 * ptr->mlevel)/ 2;	/* crude upper limit */
	if (tmp2 > 49) tmp2 = 49;		/* hard upper limit */
	return (tmp > tmp2) ? tmp2 : (tmp > 0 ? tmp : 0); /* 0 lower limit */
}